

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::DescriptorProto::InternalSerializeWithCachedSizesToArray
          (DescriptorProto *this,bool deterministic,uint8 *target)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int size;
  char *pcVar4;
  string *psVar5;
  FieldDescriptorProto *pFVar6;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  DescriptorProto_ExtensionRange *value_01;
  OneofDescriptorProto *value_02;
  DescriptorProto_ReservedRange *value_03;
  UnknownFieldSet *unknown_fields;
  int local_80;
  int n_7;
  int i_7;
  uint n_6;
  uint i_6;
  uint n_5;
  uint i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  DescriptorProto *this_local;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar3 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar1,SERIALIZE,"google.protobuf.DescriptorProto.name");
    psVar5 = name_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(1,psVar5,target);
  }
  i_1 = 0;
  uVar2 = field_size(this);
  for (; i_1 < uVar2; i_1 = i_1 + 1) {
    pFVar6 = field(this,i_1);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::FieldDescriptorProto>
                   (2,pFVar6,deterministic,_i);
  }
  i_2 = 0;
  uVar2 = nested_type_size(this);
  for (; i_2 < uVar2; i_2 = i_2 + 1) {
    value = nested_type(this,i_2);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto>
                   (3,value,deterministic,_i);
  }
  i_3 = 0;
  uVar2 = enum_type_size(this);
  for (; i_3 < uVar2; i_3 = i_3 + 1) {
    value_00 = enum_type(this,i_3);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::EnumDescriptorProto>
                   (4,value_00,deterministic,_i);
  }
  i_4 = 0;
  uVar2 = extension_range_size(this);
  for (; i_4 < uVar2; i_4 = i_4 + 1) {
    value_01 = extension_range(this,i_4);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto_ExtensionRange>
                   (5,value_01,deterministic,_i);
  }
  i_5 = 0;
  uVar2 = extension_size(this);
  for (; i_5 < uVar2; i_5 = i_5 + 1) {
    pFVar6 = extension(this,i_5);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::FieldDescriptorProto>
                   (6,pFVar6,deterministic,_i);
  }
  if ((uVar3 & 2) != 0) {
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::MessageOptions>
                   (7,this->options_,deterministic,_i);
  }
  i_6 = 0;
  uVar3 = oneof_decl_size(this);
  for (; i_6 < uVar3; i_6 = i_6 + 1) {
    value_02 = oneof_decl(this,i_6);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::OneofDescriptorProto>
                   (8,value_02,deterministic,_i);
  }
  i_7 = 0;
  uVar3 = reserved_range_size(this);
  for (; (uint)i_7 < uVar3; i_7 = i_7 + 1) {
    value_03 = reserved_range(this,i_7);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto_ReservedRange>
                   (9,value_03,deterministic,_i);
  }
  local_80 = 0;
  iVar1 = reserved_name_size(this);
  for (; local_80 < iVar1; local_80 = local_80 + 1) {
    reserved_name_abi_cxx11_(this,local_80);
    pcVar4 = (char *)std::__cxx11::string::data();
    reserved_name_abi_cxx11_(this,local_80);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,size,SERIALIZE,"google.protobuf.DescriptorProto.reserved_name");
    psVar5 = reserved_name_abi_cxx11_(this,local_80);
    _i = internal::WireFormatLite::WriteStringToArray(10,psVar5,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DescriptorProto::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* DescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0, n = this->field_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->field(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0, n = this->nested_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, this->nested_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0, n = this->extension_range_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->extension_range(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->options_, deterministic, target);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0, n = this->oneof_decl_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->oneof_decl(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0, n = this->reserved_range_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, this->reserved_range(i), deterministic, target);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->reserved_name(i).data(), this->reserved_name(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(10, this->reserved_name(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}